

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::AddOutPt(Clipper *this,TEdge *e,IntPoint *pt)

{
  pointer *pppOVar1;
  EdgeSide EVar2;
  EdgeSide EVar3;
  OutRec *pOVar4;
  iterator __position;
  long lVar5;
  OutPt *pOVar6;
  long64 lVar7;
  EdgeSide EVar8;
  OutPt *pOVar9;
  TEdge *pTVar10;
  OutPt *pOVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  OutRec *outRec;
  OutRec *local_30;
  
  if ((long)e->outIdx < 0) {
    local_30 = (OutRec *)operator_new(0x38);
    local_30->isHole = false;
    local_30->FirstLeft = (OutRec *)0x0;
    local_30->AppendLink = (OutRec *)0x0;
    local_30->pts = (OutPt *)0x0;
    local_30->bottomPt = (OutPt *)0x0;
    *(undefined8 *)((long)&local_30->bottomPt + 4) = 0;
    *(undefined8 *)((long)&local_30->bottomFlag + 4) = 0;
    __position._M_current =
         (this->m_PolyOuts).
         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_PolyOuts).
        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>::
      _M_realloc_insert<ClipperLib::OutRec*const&>
                ((vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>> *)
                 &this->m_PolyOuts,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      pppOVar1 = &(this->m_PolyOuts).
                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    pOVar4 = local_30;
    local_30->idx =
         (int)((ulong)((long)(this->m_PolyOuts).
                             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_PolyOuts).
                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    e->outIdx = local_30->idx;
    pOVar9 = (OutPt *)operator_new(0x28);
    (pOVar9->pt).X = 0;
    (pOVar9->pt).Y = 0;
    pOVar4->pts = pOVar9;
    pOVar4->bottomPt = pOVar9;
    lVar7 = pt->Y;
    (pOVar9->pt).X = pt->X;
    (pOVar9->pt).Y = lVar7;
    pOVar9->idx = pOVar4->idx;
    pOVar9->next = pOVar9;
    pOVar9->prev = pOVar9;
    pTVar10 = e->prevInAEL;
    if (pTVar10 == (TEdge *)0x0) {
      return;
    }
    bVar12 = false;
    do {
      if ((-1 < (long)pTVar10->outIdx) &&
         (bVar12 = (bool)(bVar12 ^ 1), pOVar4->FirstLeft == (OutRec *)0x0)) {
        pOVar4->FirstLeft =
             (this->m_PolyOuts).
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl
             .super__Vector_impl_data._M_start[pTVar10->outIdx];
      }
      pTVar10 = pTVar10->prevInAEL;
    } while (pTVar10 != (TEdge *)0x0);
    if (!bVar12) {
      return;
    }
    pOVar4->isHole = true;
    return;
  }
  EVar2 = e->side;
  pOVar4 = (this->m_PolyOuts).
           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
           super__Vector_impl_data._M_start[e->outIdx];
  pOVar9 = pOVar4->pts;
  if (EVar2 == esLeft) {
    if (pt->X == (pOVar9->pt).X) {
      lVar13 = (pOVar9->pt).Y;
LAB_006859d4:
      if (pt->Y == lVar13) {
        return;
      }
    }
  }
  else if (pt->X == (pOVar9->prev->pt).X) {
    lVar13 = (pOVar9->prev->pt).Y;
    goto LAB_006859d4;
  }
  EVar3 = pOVar4->sides;
  EVar8 = EVar3 | EVar2;
  if (EVar8 != EVar3) {
    if ((EVar3 == esNeither) && (pt->Y == (pOVar9->pt).Y)) {
      lVar13 = (pOVar9->pt).X;
      if (EVar2 == esLeft) {
        lVar13 = lVar13 + 1;
      }
      else {
        lVar13 = lVar13 + -1;
      }
      if (pt->X == lVar13) {
        return;
      }
    }
    pOVar4->sides = EVar8;
    if (EVar8 == esBoth) {
      if (EVar2 == esLeft) {
        lVar13 = (pOVar9->pt).Y;
        lVar14 = lVar13 - (pOVar9->next->pt).Y;
        if (((lVar14 == 0) || (lVar13 = lVar13 - pt->Y, lVar13 == 0)) ||
           (lVar5 = (pOVar9->pt).X, pOVar11 = pOVar9,
           (lVar5 - (pOVar9->next->pt).X) / lVar14 <= (lVar5 - pt->X) / lVar13)) goto LAB_00685b68;
      }
      else {
        pOVar11 = pOVar9->prev;
        lVar13 = (pOVar11->pt).Y;
        lVar14 = lVar13 - (pOVar11->prev->pt).Y;
        if (((lVar14 == 0) || (lVar13 = lVar13 - pt->Y, lVar13 == 0)) ||
           (lVar5 = (pOVar11->pt).X,
           (lVar5 - pt->X) / lVar13 <= (lVar5 - (pOVar11->prev->pt).X) / lVar14)) goto LAB_00685b68;
      }
      pOVar4->bottomFlag = pOVar11;
    }
  }
LAB_00685b68:
  pOVar11 = (OutPt *)operator_new(0x28);
  lVar7 = pt->Y;
  (pOVar11->pt).X = pt->X;
  (pOVar11->pt).Y = lVar7;
  pOVar11->idx = pOVar4->idx;
  if (((pOVar11->pt).Y == (pOVar4->bottomPt->pt).Y) && ((pOVar11->pt).X < (pOVar4->bottomPt->pt).X))
  {
    pOVar4->bottomPt = pOVar11;
  }
  pOVar11->next = pOVar9;
  pOVar6 = pOVar9->prev;
  pOVar11->prev = pOVar6;
  pOVar6->next = pOVar11;
  pOVar9->prev = pOVar11;
  if (EVar2 == esLeft) {
    pOVar4->pts = pOVar11;
  }
  return;
}

Assistant:

void Clipper::AddOutPt(TEdge *e, const IntPoint &pt)
{
  bool ToFront = (e->side == esLeft);
  if(  e->outIdx < 0 )
  {
    OutRec *outRec = CreateOutRec();
    m_PolyOuts.push_back(outRec);
    outRec->idx = (int)m_PolyOuts.size()-1;
    e->outIdx = outRec->idx;
    OutPt* op = new OutPt;
    outRec->pts = op;
    outRec->bottomPt = op;
    op->pt = pt;
    op->idx = outRec->idx;
    op->next = op;
    op->prev = op;
    SetHoleState(e, outRec);
  } else
  {
    OutRec *outRec = m_PolyOuts[e->outIdx];
    OutPt* op = outRec->pts;
    if ((ToFront && PointsEqual(pt, op->pt)) ||
      (!ToFront && PointsEqual(pt, op->prev->pt))) return;

    if ((e->side | outRec->sides) != outRec->sides)
    {
      //check for 'rounding' artefacts ...
      if (outRec->sides == esNeither && pt.Y == op->pt.Y)
      {
        if (ToFront)
        {
          if (pt.X == op->pt.X +1) return;    //ie wrong side of bottomPt
        }
        else if (pt.X == op->pt.X -1) return; //ie wrong side of bottomPt
      }

      outRec->sides = (EdgeSide)(outRec->sides | e->side);
      if (outRec->sides == esBoth)
      {
        //A vertex from each side has now been added.
        //Vertices of one side of an output polygon are quite commonly close to
        //or even 'touching' edges of the other side of the output polygon.
        //Very occasionally vertices from one side can 'cross' an edge on the
        //the other side. The distance 'crossed' is always less that a unit
        //and is purely an artefact of coordinate rounding. Nevertheless, this
        //results in very tiny self-intersections. Because of the way
        //orientation is calculated, even tiny self-intersections can cause
        //the Orientation function to return the wrong result. Therefore, it's
        //important to ensure that any self-intersections close to BottomPt are
        //detected and removed before orientation is assigned.

        OutPt *opBot, *op2;
        if (ToFront)
        {
          opBot = outRec->pts;
          op2 = opBot->next; //op2 == right side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) <
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        } else
        {
          opBot = outRec->pts->prev;
          op2 = opBot->prev; //op2 == left side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) >
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        }
      }
    }

    OutPt* op2 = new OutPt;
    op2->pt = pt;
    op2->idx = outRec->idx;
    if (op2->pt.Y == outRec->bottomPt->pt.Y &&
      op2->pt.X < outRec->bottomPt->pt.X)
        outRec->bottomPt = op2;
    op2->next = op;
    op2->prev = op->prev;
    op2->prev->next = op2;
    op->prev = op2;
    if (ToFront) outRec->pts = op2;
  }
}